

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O0

void __thiscall DatasetBuilder::clear(DatasetBuilder *this)

{
  bool bVar1;
  runtime_error *this_00;
  int *in_RDI;
  IndexType *index_type;
  iterator __end1;
  iterator __begin1;
  vector<IndexType,_std::allocator<IndexType>_> *__range1;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_ffffffffffffff88;
  __normal_iterator<IndexType_*,_std::vector<IndexType,_std::allocator<IndexType>_>_>
  *in_stack_ffffffffffffff90;
  unique_ptr<BitmapIndexBuilder,_std::default_delete<BitmapIndexBuilder>_>
  *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  *in_stack_ffffffffffffffa0;
  IndexType *in_stack_ffffffffffffffa8;
  unique_ptr<BitmapIndexBuilder,_std::default_delete<BitmapIndexBuilder>_> local_48 [3];
  IndexType local_30 [2];
  reference local_28;
  IndexType *local_20;
  __normal_iterator<IndexType_*,_std::vector<IndexType,_std::allocator<IndexType>_>_> local_18;
  int *local_10;
  
  std::
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  ::clear((vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           *)0x1b860c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1b861a);
  local_10 = in_RDI + 2;
  local_18._M_current =
       (IndexType *)
       std::vector<IndexType,_std::allocator<IndexType>_>::begin(in_stack_ffffffffffffff88);
  local_20 = (IndexType *)
             std::vector<IndexType,_std::allocator<IndexType>_>::end(in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<IndexType_*,_std::vector<IndexType,_std::allocator<IndexType>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return;
    }
    local_28 = __gnu_cxx::
               __normal_iterator<IndexType_*,_std::vector<IndexType,_std::allocator<IndexType>_>_>::
               operator*(&local_18);
    if (*in_RDI == 1) {
      in_stack_ffffffffffffffa0 =
           (vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
            *)(in_RDI + 0xe);
      in_stack_ffffffffffffffa8 = local_30;
      std::make_unique<FlatIndexBuilder,IndexType_const&>(in_stack_ffffffffffffffa8);
      std::
      vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
      ::emplace_back<std::unique_ptr<FlatIndexBuilder,std::default_delete<FlatIndexBuilder>>>
                (in_stack_ffffffffffffffa0,
                 (unique_ptr<FlatIndexBuilder,_std::default_delete<FlatIndexBuilder>_> *)
                 in_stack_ffffffffffffff98);
      std::unique_ptr<FlatIndexBuilder,_std::default_delete<FlatIndexBuilder>_>::~unique_ptr
                ((unique_ptr<FlatIndexBuilder,_std::default_delete<FlatIndexBuilder>_> *)
                 in_stack_ffffffffffffff90);
    }
    else {
      if (*in_RDI != 2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"unhandled builder type");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_stack_ffffffffffffff90 =
           (__normal_iterator<IndexType_*,_std::vector<IndexType,_std::allocator<IndexType>_>_> *)
           (in_RDI + 0xe);
      in_stack_ffffffffffffff98 = local_48;
      std::make_unique<BitmapIndexBuilder,IndexType_const&>(in_stack_ffffffffffffffa8);
      std::
      vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
      ::emplace_back<std::unique_ptr<BitmapIndexBuilder,std::default_delete<BitmapIndexBuilder>>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::unique_ptr<BitmapIndexBuilder,_std::default_delete<BitmapIndexBuilder>_>::~unique_ptr
                ((unique_ptr<BitmapIndexBuilder,_std::default_delete<BitmapIndexBuilder>_> *)
                 in_stack_ffffffffffffff90);
    }
    __gnu_cxx::__normal_iterator<IndexType_*,_std::vector<IndexType,_std::allocator<IndexType>_>_>::
    operator++(&local_18);
  } while( true );
}

Assistant:

void DatasetBuilder::clear() {
    indices.clear();
    fids.clear();

    for (const auto &index_type : index_types) {
        if (builder_type == BuilderType::FLAT) {
            indices.emplace_back(
                std::make_unique<FlatIndexBuilder>(index_type));
        } else if (builder_type == BuilderType::BITMAP) {
            indices.emplace_back(
                std::make_unique<BitmapIndexBuilder>(index_type));
        } else {
            throw std::runtime_error("unhandled builder type");
        }
    }
}